

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::getCommandBufferMutableConfigString
          (CLIntercept *this,cl_uint num_configs,cl_command_buffer_update_type_khr *config_types,
          void **configs,string *str)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer ppVar5;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  CLIntercept *in_RDI;
  string *in_R8;
  string dispatchStr;
  const_iterator iter;
  cl_uint work_dim;
  cl_mutable_dispatch_exec_info_khr *info;
  cl_uint a_2;
  cl_mutable_dispatch_arg_khr *arg_1;
  cl_uint a_1;
  cl_ulong *pData_1;
  cl_uint *pData;
  cl_mem *pMem;
  cl_mutable_dispatch_arg_khr *arg;
  cl_uint a;
  cl_mutable_dispatch_config_khr *dispatchConfig;
  cl_uint i;
  char s [256];
  undefined4 uVar6;
  map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
  *this_00;
  cl_command_buffer_update_type_khr in_stack_fffffffffffffe04;
  CEnumNameMap *in_stack_fffffffffffffe08;
  _Self local_1d8;
  _Self local_1d0;
  cl_uint local_1c4;
  string local_1c0 [32];
  uint *local_1a0;
  uint local_194;
  uint *local_190;
  uint local_184;
  undefined8 *local_180;
  undefined4 *local_178;
  undefined8 *local_170;
  uint *local_168;
  uint local_15c;
  string local_158 [32];
  undefined8 *local_138;
  uint local_12c;
  char local_128 [144];
  string *in_stack_ffffffffffffff68;
  size_t *in_stack_ffffffffffffff70;
  size_t *in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  cl_uint in_stack_ffffffffffffff8c;
  CLIntercept *in_stack_ffffffffffffff90;
  
  std::__cxx11::string::operator=(in_R8,"");
  if (((in_ESI != 0) && (in_RDX != 0)) && (in_RCX != 0)) {
    for (local_12c = 0; uVar1 = local_12c, local_12c < in_ESI; local_12c = local_12c + 1) {
      if (*(long *)(in_RCX + (ulong)local_12c * 8) == 0) {
        snprintf(local_128,0x100,"\n  config %u: NULL!",(ulong)local_12c);
        std::__cxx11::string::operator+=(in_R8,local_128);
      }
      else if (*(int *)(in_RDX + (ulong)local_12c * 4) == 0) {
        local_138 = *(undefined8 **)(in_RCX + (ulong)local_12c * 8);
        enumName(in_RDI);
        CEnumNameMap::name_command_buffer_update_type_abi_cxx11_
                  (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
        uVar3 = std::__cxx11::string::c_str();
        uVar4 = *local_138;
        snprintf(local_128,0x100,"\n  config %u: type = %s (%u), command = %p:",(ulong)uVar1,uVar3,
                 (ulong)*(uint *)(in_RDX + (ulong)local_12c * 4),uVar4);
        uVar6 = (undefined4)((ulong)uVar4 >> 0x20);
        std::__cxx11::string::~string(local_158);
        std::__cxx11::string::operator+=(in_R8,local_128);
        this_00 = (map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
                   *)CONCAT44(uVar6,*(undefined4 *)((long)local_138 + 0x14));
        snprintf(local_128,0x100,
                 "\n    num_args = %u, num_svm_args = %u, num_exec_infos = %u, work_dim = %u",
                 (ulong)*(uint *)(local_138 + 1),(ulong)*(uint *)((long)local_138 + 0xc),
                 (ulong)*(uint *)(local_138 + 2));
        std::__cxx11::string::operator+=(in_R8,local_128);
        if ((*(int *)(local_138 + 1) == 0) || (local_138[3] != 0)) {
          for (local_15c = 0; local_15c < *(uint *)(local_138 + 1); local_15c = local_15c + 1) {
            local_168 = (uint *)(local_138[3] + (ulong)local_15c * 0x18);
            if ((*(long *)(local_168 + 4) == 0) || (*(long *)(local_168 + 2) != 8)) {
              if ((*(long *)(local_168 + 4) == 0) || (*(long *)(local_168 + 2) != 4)) {
                if ((*(long *)(local_168 + 4) == 0) || (*(long *)(local_168 + 2) != 8)) {
                  snprintf(local_128,0x100,"\n      arg %u: arg_index = %u, arg_size = %zu",
                           (ulong)local_15c,(ulong)*local_168,*(undefined8 *)(local_168 + 2));
                }
                else {
                  local_180 = *(undefined8 **)(local_168 + 4);
                  this_00 = (map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
                             *)*local_180;
                  snprintf(local_128,0x100,
                           "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = 0x%lx",
                           (ulong)local_15c,(ulong)*local_168,*(undefined8 *)(local_168 + 2));
                }
              }
              else {
                local_178 = *(undefined4 **)(local_168 + 4);
                this_00 = (map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
                           *)CONCAT44((int)((ulong)this_00 >> 0x20),*local_178);
                snprintf(local_128,0x100,
                         "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = 0x%x",
                         (ulong)local_15c,(ulong)*local_168,*(undefined8 *)(local_168 + 2));
              }
            }
            else {
              local_170 = *(undefined8 **)(local_168 + 4);
              this_00 = (map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
                         *)*local_170;
              snprintf(local_128,0x100,
                       "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = %p",
                       (ulong)local_15c,(ulong)*local_168,*(undefined8 *)(local_168 + 2));
            }
            std::__cxx11::string::operator+=(in_R8,local_128);
          }
        }
        else {
          snprintf(local_128,0x100,"\n      error: num_args is %u and arg_list is NULL!",
                   (ulong)*(uint *)(local_138 + 1));
          std::__cxx11::string::operator+=(in_R8,local_128);
        }
        if ((*(int *)((long)local_138 + 0xc) == 0) || (local_138[4] != 0)) {
          for (local_184 = 0; local_184 < *(uint *)((long)local_138 + 0xc);
              local_184 = local_184 + 1) {
            local_190 = (uint *)(local_138[4] + (ulong)local_184 * 0x18);
            snprintf(local_128,0x100,"\n      svm arg %u: arg_index = %u, arg_value = %p",
                     (ulong)local_184,(ulong)*local_190,*(undefined8 *)(local_190 + 4));
            std::__cxx11::string::operator+=(in_R8,local_128);
          }
        }
        else {
          snprintf(local_128,0x100,"\n      error: num_svm_args is %u and arg_svm_list is NULL!",
                   (ulong)*(uint *)((long)local_138 + 0xc));
          std::__cxx11::string::operator+=(in_R8,local_128);
        }
        if ((*(int *)(local_138 + 2) == 0) || (local_138[5] != 0)) {
          for (local_194 = 0; uVar1 = local_194, local_194 < *(uint *)(local_138 + 2);
              local_194 = local_194 + 1) {
            local_1a0 = (uint *)(local_138[5] + (ulong)local_194 * 0x18);
            enumName(in_RDI);
            CEnumNameMap::name_abi_cxx11_(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
            uVar4 = std::__cxx11::string::c_str();
            this_00 = *(map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
                        **)(local_1a0 + 2);
            snprintf(local_128,0x100,
                     "\n      exec info %u: param_name = %s (%04X), param_value_size = %zu, param_value = %p"
                     ,(ulong)uVar1,uVar4,(ulong)*local_1a0,this_00,*(undefined8 *)(local_1a0 + 4));
            std::__cxx11::string::~string(local_1c0);
            std::__cxx11::string::operator+=(in_R8,local_128);
          }
        }
        else {
          snprintf(local_128,0x100,"\n      error: num_exec_infos is %u and exec_info_list is NULL!"
                   ,(ulong)*(uint *)(local_138 + 2));
          std::__cxx11::string::operator+=(in_R8,local_128);
        }
        if (((local_138[6] != 0) || (local_138[7] != 0)) || (local_138[8] != 0)) {
          local_1c4 = *(cl_uint *)((long)local_138 + 0x14);
          if (local_1c4 == 0) {
            local_1d0._M_node =
                 (_Base_ptr)
                 std::
                 map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
                 ::find(this_00,(key_type *)0x1f2867);
            local_1d8._M_node =
                 (_Base_ptr)
                 std::
                 map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
                 ::end(this_00);
            bVar2 = std::operator!=(&local_1d0,&local_1d8);
            if (bVar2) {
              ppVar5 = std::
                       _Rb_tree_const_iterator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>
                       ::operator->((_Rb_tree_const_iterator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>
                                     *)0x1f28a1);
              local_1c4 = (ppVar5->second).WorkDim;
            }
          }
          if (local_1c4 != 0) {
            std::__cxx11::string::string((string *)&stack0xfffffffffffffe08);
            getEnqueueNDRangeKernelArgsString
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80
                       ,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                       in_stack_ffffffffffffff68);
            std::__cxx11::string::operator+=(in_R8,"\n      ");
            std::__cxx11::string::operator+=(in_R8,(string *)&stack0xfffffffffffffe08);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
          }
        }
      }
      else {
        snprintf(local_128,0x100,"\n  config %u: unknown type %u!",(ulong)local_12c,
                 (ulong)*(uint *)(in_RDX + (ulong)local_12c * 4));
        std::__cxx11::string::operator+=(in_R8,local_128);
      }
    }
  }
  return;
}

Assistant:

void CLIntercept::getCommandBufferMutableConfigString(
    cl_uint num_configs,
    const cl_command_buffer_update_type_khr* config_types,
    const void** configs,
    std::string& str ) const
{
    str = "";

    if( num_configs > 0 && config_types != nullptr && configs != nullptr )
    {
        char s[256];

        for( cl_uint i = 0; i < num_configs; i++ )
        {
            if( configs[i] == nullptr )
            {
                CLI_SPRINTF(s, 256, "\n  config %u: NULL!", i );
                str += s;
            }
            else if( config_types[i] == CL_STRUCTURE_TYPE_MUTABLE_DISPATCH_CONFIG_KHR )
            {
                auto dispatchConfig = (const cl_mutable_dispatch_config_khr*)configs[i];
                CLI_SPRINTF(s, 256, "\n  config %u: type = %s (%u), command = %p:",
                    i,
                    enumName().name_command_buffer_update_type(config_types[i]).c_str(),
                    config_types[i],
                    dispatchConfig->command);
                str += s;

                CLI_SPRINTF(s, 256, "\n    num_args = %u, num_svm_args = %u, num_exec_infos = %u, work_dim = %u",
                    dispatchConfig->num_args,
                    dispatchConfig->num_svm_args,
                    dispatchConfig->num_exec_infos,
                    dispatchConfig->work_dim);
                str += s;

                if( dispatchConfig->num_args != 0 &&
                    dispatchConfig->arg_list == nullptr )
                {
                        CLI_SPRINTF(s, 256, "\n      error: num_args is %u and arg_list is NULL!",
                            dispatchConfig->num_args);
                        str += s;
                }
                else
                {
                    for( cl_uint a = 0; a < dispatchConfig->num_args; a++ )
                    {
                        const cl_mutable_dispatch_arg_khr* arg =
                            &dispatchConfig->arg_list[a];
                        if( ( arg->arg_value != NULL ) &&
                            ( arg->arg_size == sizeof(cl_mem) ) )
                        {
                            cl_mem* pMem = (cl_mem*)arg->arg_value;
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = %p",
                                a,
                                arg->arg_index,
                                arg->arg_size,
                                pMem[0] );
                        }
                        else if( ( arg->arg_value != NULL ) &&
                                 ( arg->arg_size == sizeof(cl_uint) ) )
                        {
                            cl_uint*    pData = (cl_uint*)arg->arg_value;
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = 0x%x",
                                a,
                                arg->arg_index,
                                arg->arg_size,
                                pData[0]);
                        }
                        else if( ( arg->arg_value != NULL ) &&
                                 ( arg->arg_size == sizeof(cl_ulong) ) )
                        {
                            cl_ulong*   pData = (cl_ulong*)arg->arg_value;
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = 0x%" PRIx64,
                                a,
                                arg->arg_index,
                                arg->arg_size,
                                pData[0]);
                        }
                        else
                        {
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu",
                                a,
                                arg->arg_index,
                                arg->arg_size);
                        }

                        str += s;
                    }
                }

                if( dispatchConfig->num_svm_args != 0 &&
                    dispatchConfig->arg_svm_list == nullptr )
                {
                        CLI_SPRINTF(s, 256, "\n      error: num_svm_args is %u and arg_svm_list is NULL!",
                            dispatchConfig->num_svm_args);
                        str += s;
                }
                else
                {
                    for( cl_uint a = 0; a < dispatchConfig->num_svm_args; a++ )
                    {
                        const cl_mutable_dispatch_arg_khr* arg =
                            &dispatchConfig->arg_svm_list[a];
                        CLI_SPRINTF(s, 256, "\n      svm arg %u: arg_index = %u, arg_value = %p",
                            a,
                            arg->arg_index,
                            arg->arg_value);
                        str += s;
                    }
                }

                if( dispatchConfig->num_exec_infos != 0 &&
                    dispatchConfig->exec_info_list == nullptr )
                {
                        CLI_SPRINTF(s, 256, "\n      error: num_exec_infos is %u and exec_info_list is NULL!",
                            dispatchConfig->num_exec_infos);
                        str += s;
                }
                else
                {
                    for( cl_uint a = 0; a < dispatchConfig->num_exec_infos; a++ )
                    {
                        const cl_mutable_dispatch_exec_info_khr* info =
                            &dispatchConfig->exec_info_list[a];
                        CLI_SPRINTF(s, 256, "\n      exec info %u: param_name = %s (%04X), param_value_size = %zu, param_value = %p",
                            a,
                            enumName().name(info->param_name).c_str(),
                            info->param_name,
                            info->param_value_size,
                            info->param_value);
                        str += s;
                    }
                }

                if( dispatchConfig->global_work_offset != nullptr ||
                    dispatchConfig->global_work_size != nullptr ||
                    dispatchConfig->local_work_size != nullptr )
                {
                    cl_uint work_dim = dispatchConfig->work_dim;
                    if( work_dim == 0 )
                    {
                        // TODO: lock?
                        auto iter = m_MutableCommandInfoMap.find(
                            dispatchConfig->command);
                        if( iter != m_MutableCommandInfoMap.end() )
                        {
                            work_dim = iter->second.WorkDim;
                        }
                    }
                    if( work_dim != 0 )
                    {
                        std::string dispatchStr;
                        getEnqueueNDRangeKernelArgsString(
                            work_dim,
                            dispatchConfig->global_work_offset,
                            dispatchConfig->global_work_size,
                            dispatchConfig->local_work_size,
                            dispatchStr);
                        str += "\n      ";
                        str += dispatchStr;
                    }
                }
            }
            else
            {
                CLI_SPRINTF(s, 256, "\n  config %u: unknown type %u!",
                    i,
                    config_types[i] );
                str += s;
            }
        }
    }
}